

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  size_t _elemsize;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Option *opt_00;
  Mat *pMVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [64];
  undefined1 (*pauVar23) [64];
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ulong local_b80;
  long local_b78;
  undefined1 local_b70 [16];
  Mat local_b60;
  void *local_b18;
  ulong local_b10;
  long local_b08;
  long local_b00;
  ulong local_af8;
  ulong local_af0;
  long local_ae8;
  ulong local_ae0;
  int local_ad8;
  int local_ad4;
  Mat local_ad0;
  Option *local_a80;
  Mat *local_a78;
  Mat local_a70;
  Mat local_a20;
  undefined8 local_9d8;
  ulong local_9d0;
  Mat *local_9c8;
  size_t local_9c0;
  Mat *local_9b8;
  long local_9b0;
  long local_9a8;
  long local_9a0;
  long local_998;
  undefined1 local_990 [16];
  undefined1 auStack_980 [384];
  undefined1 auStack_800 [384];
  undefined1 auStack_680 [384];
  undefined1 auStack_500 [384];
  undefined1 auStack_380 [384];
  undefined1 auStack_200 [384];
  undefined1 auStack_80 [80];
  
  iVar18 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar5 = bottom_blob->elempack;
  uVar1 = top_blob->w;
  uVar3 = top_blob->h;
  auVar29._4_4_ = uVar3;
  auVar29._0_4_ = uVar1;
  local_ad4 = top_blob->c;
  piVar6 = bottom_blob->refcount;
  local_ad0.data = bottom_blob->data;
  local_ad0.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_ad0.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_ad0.allocator = bottom_blob->allocator;
  uVar8 = bottom_blob->dims;
  uVar9 = bottom_blob->w;
  uVar10 = bottom_blob->h;
  uVar11 = bottom_blob->d;
  local_ad0.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  auVar42._8_4_ = 3;
  auVar42._0_8_ = 0x300000003;
  auVar42._12_4_ = 3;
  auVar29._8_8_ = 0;
  auVar29 = vpaddd_avx512vl(auVar29,auVar42);
  auVar42 = vpsrad_avx(auVar29,0x1f);
  auVar42 = vpsrld_avx(auVar42,0x1e);
  local_b70 = vpaddd_avx(auVar29,auVar42);
  auVar7._8_4_ = 0xfffffffc;
  auVar7._0_8_ = 0xfffffffcfffffffc;
  auVar7._12_4_ = 0xfffffffc;
  local_990 = vpandd_avx512vl(local_b70,auVar7);
  local_9d0 = (ulong)local_990._4_4_;
  local_9d8 = CONCAT44((int)(local_ad0.cstep >> 0x20),local_990._0_4_);
  local_ad0.elemsize = _elemsize;
  local_ad0.elempack = iVar5;
  local_ad0.dims = uVar8;
  local_ad0.w = uVar9;
  local_ad0.h = uVar10;
  local_ad0.d = uVar11;
  local_ad0.c = iVar18;
  local_9c8 = bias;
  local_9b8 = kernel_tm;
  copy_make_border(bottom_blob,&local_ad0,0,(local_990._4_4_ + 2) - bottom_blob->h,0,
                   (local_990._0_4_ + 2) - bottom_blob->w,0,0.0,opt);
  auVar42 = vpsrad_avx512vl(local_b70,2);
  local_a70.cstep = 0;
  auVar29 = vpshufd_avx(auVar42,0x55);
  auVar29 = vpmulld_avx(auVar29,auVar42);
  local_a70.data = (void *)0x0;
  local_a70.refcount._0_4_ = 0;
  local_a70.refcount._4_4_ = 0;
  local_a70.elemsize = 0;
  local_a70.elempack = 0;
  local_a70.allocator = (Allocator *)0x0;
  local_a70.dims = 0;
  local_a70.w = 0;
  local_a70.h = 0;
  local_a70.d = 0;
  local_a70.c = 0;
  local_ad8 = iVar5;
  local_a80 = opt;
  local_a78 = top_blob;
  local_9c0 = _elemsize;
  Mat::create(&local_a70,auVar29._0_4_,0x24,iVar18,_elemsize,iVar5,opt->workspace_allocator);
  pMVar16 = local_a78;
  opt_00 = local_a80;
  iVar5 = local_ad4;
  iVar18 = local_ad8;
  local_b08 = (long)local_ad0.c;
  if (0 < local_b08) {
    local_af0 = (ulong)(uint)local_ad0.w;
    local_b10 = (ulong)(uint)local_ad0.h;
    iVar19 = local_ad0.h + 1;
    if (-1 < (int)(local_ad0.h - 2U)) {
      iVar19 = local_ad0.h - 2U;
    }
    uVar20 = iVar19 >> 2;
    iVar19 = local_ad0.w + 1;
    if (-1 < (int)(local_ad0.w - 2U)) {
      iVar19 = local_ad0.w - 2U;
    }
    uVar17 = iVar19 >> 2;
    iVar19 = uVar17 * uVar20;
    uVar26 = 1;
    if (1 < (int)uVar17) {
      uVar26 = (ulong)uVar17;
    }
    if ((int)uVar20 < 2) {
      uVar20 = 1;
    }
    local_af8 = (ulong)uVar20;
    local_b00 = (long)(int)uVar17 * 0x40;
    local_b18 = (void *)((long)(iVar19 * 0x10) * 4);
    local_998 = (long)(iVar19 * 0x20) * 4;
    local_9a0 = (long)(iVar19 * 0x30) * 4;
    local_9a8 = (long)(iVar19 * 0x40) * 4;
    local_9b0 = (long)(iVar19 * 0x50) * 4;
    local_b78 = 0;
    auVar30 = vbroadcastss_avx512f(ZEXT416(0xc0800000));
    auVar31 = vbroadcastss_avx512f(ZEXT416(0xc0a00000));
    auVar32 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
    do {
      if (5 < local_ad0.h) {
        local_ae8 = (long)local_ad0.w * local_ad0.elemsize * 4;
        lVar25 = local_a70.elemsize * local_a70.cstep * local_b78;
        local_b70._0_8_ =
             (long)local_ad0.data + local_ad0.elemsize * local_ad0.cstep * local_b78 + 0x140;
        local_b80 = 0;
        uVar21 = 0;
        do {
          local_ae0 = uVar21;
          if (5 < local_ad0.w) {
            uVar24 = 0;
            uVar21 = local_b80;
            pauVar22 = (undefined1 (*) [64])local_b70._0_8_;
            do {
              lVar27 = -0x180;
              pauVar23 = pauVar22;
              do {
                auVar39 = pauVar23[-4];
                auVar37 = pauVar23[-3];
                auVar40 = pauVar23[-2];
                auVar38 = pauVar23[-1];
                auVar33 = vfnmadd132ps_avx512vl(pauVar23[-5],auVar38,auVar30);
                auVar33 = vfmadd231ps_avx512f(auVar33,auVar37,auVar31);
                auVar34 = vaddps_avx512f(auVar37,auVar39);
                auVar35 = vaddps_avx512f(auVar38,auVar40);
                auVar34 = vfmadd231ps_avx512f(auVar35,auVar30,auVar34);
                auVar35 = vsubps_avx512f(auVar39,auVar37);
                auVar36 = vsubps_avx512f(auVar38,auVar40);
                auVar35 = vfnmadd231ps_avx512f(auVar36,auVar30,auVar35);
                auVar36 = vsubps_avx512f(auVar39,auVar40);
                auVar37 = vsubps_avx512f(auVar38,auVar37);
                auVar38 = vfmadd213ps_avx512f(auVar32,auVar36,auVar37);
                auVar37 = vfnmadd213ps_avx512f(auVar36,auVar32,auVar37);
                auVar39 = vfnmadd213ps_avx512f(auVar39,auVar30,*pauVar23);
                auVar39 = vfmadd231ps_avx512f(auVar39,auVar31,auVar40);
                *(undefined1 (*) [64])(auStack_800 + lVar27) = auVar33;
                *(undefined1 (*) [64])(auStack_680 + lVar27) = auVar34;
                *(undefined1 (*) [64])(auStack_500 + lVar27) = auVar35;
                *(undefined1 (*) [64])(auStack_380 + lVar27) = auVar38;
                *(undefined1 (*) [64])(auStack_200 + lVar27) = auVar37;
                *(undefined1 (*) [64])(auStack_80 + lVar27) = auVar39;
                pauVar23 = (undefined1 (*) [64])(*pauVar23 + (long)(local_ad0.w << 4) * 4);
                lVar27 = lVar27 + 0x40;
              } while (lVar27 != 0);
              lVar28 = 0x140;
              lVar27 = uVar21;
              do {
                auVar39 = *(undefined1 (*) [64])((long)&local_a80 + lVar28);
                auVar37 = *(undefined1 (*) [64])((long)&local_a70.h + lVar28);
                auVar40 = *(undefined1 (*) [64])((long)&local_a20.allocator + lVar28);
                auVar38 = *(undefined1 (*) [64])((long)&local_9c0 + lVar28);
                auVar33 = vfnmadd132ps_avx512vl
                                    (*(undefined1 (*) [64])((long)&local_ad0.elemsize + lVar28),
                                     auVar38,auVar30);
                auVar33 = vfmadd231ps_avx512f(auVar33,auVar37,auVar31);
                auVar34 = vaddps_avx512f(auVar37,auVar39);
                auVar35 = vaddps_avx512f(auVar38,auVar40);
                auVar34 = vfmadd231ps_avx512f(auVar35,auVar30,auVar34);
                auVar35 = vsubps_avx512f(auVar39,auVar37);
                auVar36 = vsubps_avx512f(auVar38,auVar40);
                auVar35 = vfnmadd231ps_avx512f(auVar36,auVar30,auVar35);
                auVar36 = vsubps_avx512f(auVar39,auVar40);
                auVar37 = vsubps_avx512f(auVar38,auVar37);
                auVar38 = vfmadd213ps_avx512f(auVar32,auVar36,auVar37);
                auVar37 = vfnmadd213ps_avx512f(auVar36,auVar32,auVar37);
                auVar39 = vfnmadd213ps_avx512f
                                    (auVar39,auVar30,*(undefined1 (*) [64])(auStack_980 + lVar28));
                auVar39 = vfmadd231ps_avx512f(auVar39,auVar31,auVar40);
                *(undefined1 (*) [64])((long)local_a70.data + lVar27 + lVar25) = auVar33;
                *(undefined1 (*) [64])((long)local_a70.data + (long)local_b18 + lVar27 + lVar25) =
                     auVar34;
                *(undefined1 (*) [64])((long)local_a70.data + lVar27 + local_998 + lVar25) = auVar35
                ;
                *(undefined1 (*) [64])((long)local_a70.data + lVar27 + local_9a0 + lVar25) = auVar38
                ;
                *(undefined1 (*) [64])((long)local_a70.data + lVar27 + local_9a8 + lVar25) = auVar37
                ;
                *(undefined1 (*) [64])((long)local_a70.data + lVar27 + local_9b0 + lVar25) = auVar39
                ;
                lVar28 = lVar28 + 0x180;
                lVar27 = lVar27 + (long)(iVar19 * 0x60) * 4;
              } while (lVar28 != 0xa40);
              uVar24 = uVar24 + 1;
              pauVar22 = pauVar22 + 4;
              uVar21 = uVar21 + 0x40;
            } while (uVar24 != uVar26);
          }
          local_b70._0_8_ = (undefined1 *)local_b70._0_8_ + local_ae8;
          local_b80 = local_b80 + local_b00;
          uVar21 = local_ae0 + 1;
        } while (local_ae0 + 1 != local_af8);
      }
      local_b78 = local_b78 + 1;
    } while (local_b78 != local_b08);
  }
  piVar6 = (int *)CONCAT44(local_ad0.refcount._4_4_,local_ad0.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_ad0.allocator == (Allocator *)0x0) {
        if (local_ad0.data != (void *)0x0) {
          free(local_ad0.data);
        }
      }
      else {
        (*(local_ad0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_ad0.cstep = 0;
  local_ad0.data = (void *)0x0;
  local_ad0.refcount._0_4_ = 0;
  local_ad0.refcount._4_4_ = 0;
  local_ad0.elemsize = 0;
  local_ad0.elempack = 0;
  local_ad0.h = 0;
  local_ad0.d = 0;
  local_ad0.c = 0;
  local_ad0.allocator = (Allocator *)0x0;
  local_ad0.dims = 0;
  local_ad0.w = 0;
  local_a20.cstep = 0;
  local_a20.data = (void *)0x0;
  local_a20.refcount._0_4_ = 0;
  local_a20.refcount._4_4_ = 0;
  local_a20.elemsize = 0;
  local_a20.elempack = 0;
  local_a20.allocator = (Allocator *)0x0;
  local_a20.dims = 0;
  local_a20.w = 0;
  local_a20.h = 0;
  local_a20.d = 0;
  local_a20.c = 0;
  convolution_winograd_dot_pack16_avx512(&local_a70,iVar5,local_9b8,&local_a20,opt_00);
  local_b60.cstep = 0;
  local_b60.data = (void *)0x0;
  local_b60.refcount._0_4_ = 0;
  local_b60.refcount._4_4_ = 0;
  local_b60.elemsize = 0;
  local_b60.elempack = 0;
  local_b60.allocator = (Allocator *)0x0;
  local_b60.dims = 0;
  local_b60.w = 0;
  local_b60.h = 0;
  local_b60.d = 0;
  local_b60.c = 0;
  uVar2 = pMVar16->w;
  uVar4 = pMVar16->h;
  auVar41._4_4_ = uVar4;
  auVar41._0_4_ = uVar2;
  auVar41._8_8_ = 0;
  uVar26 = vpcmpd_avx512vl(auVar41,local_990,4);
  if ((uVar26 & 3) == 0) {
    if (&local_b60 != pMVar16) {
      piVar6 = pMVar16->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      local_b60.data = pMVar16->data;
      local_b60.refcount._0_4_ = SUB84(pMVar16->refcount,0);
      local_b60.refcount._4_4_ = (undefined4)((ulong)pMVar16->refcount >> 0x20);
      local_b60.elemsize = pMVar16->elemsize;
      local_b60.elempack = pMVar16->elempack;
      local_b60.allocator = pMVar16->allocator;
      uVar12 = pMVar16->dims;
      uVar13 = pMVar16->w;
      uVar14 = pMVar16->h;
      uVar15 = pMVar16->d;
      local_b60.c = pMVar16->c;
      local_b60.cstep = pMVar16->cstep;
      local_b60.dims = uVar12;
      local_b60.w = uVar13;
      local_b60.h = uVar14;
      local_b60.d = uVar15;
    }
  }
  else {
    Mat::create(&local_b60,(int)local_9d8,(int)local_9d0,iVar5,local_9c0,iVar18,
                opt_00->workspace_allocator);
  }
  local_b08 = (long)local_b60.c;
  if (0 < local_b08) {
    local_af0 = (ulong)(uint)local_b60.w;
    local_b10 = (ulong)(uint)local_b60.h;
    uVar20 = local_b60.h + 3;
    if (-1 < local_b60.h) {
      uVar20 = local_b60.h;
    }
    local_af8 = (ulong)(uint)((int)uVar20 >> 2);
    uVar17 = local_b60.w + 3;
    if (-1 < local_b60.w) {
      uVar17 = local_b60.w;
    }
    local_b18 = local_9c8->data;
    uVar17 = (int)uVar17 >> 2;
    iVar18 = uVar17 * ((int)uVar20 >> 2);
    local_b00 = (ulong)uVar17 * 0x10;
    auVar30 = vbroadcastss_avx512f(ZEXT416(0x40000000));
    auVar31 = vbroadcastss_avx512f(ZEXT416(0x40800000));
    auVar32 = vbroadcastss_avx512f(ZEXT416(0x41000000));
    lVar25 = 0;
    do {
      if (local_b18 == (void *)0x0) {
        auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
        auVar39 = *(undefined1 (*) [64])((long)local_b18 + lVar25 * 0x40);
      }
      if (3 < local_b60.h) {
        local_ae8 = (long)local_b60.w * local_b60.elemsize * 4;
        local_b70._0_8_ =
             (long)local_b60.data + local_b60.elemsize * local_b60.cstep * lVar25 + 0xc0;
        local_b80 = 0;
        uVar26 = 0;
        do {
          local_ae0 = uVar26;
          if (3 < local_b60.w) {
            uVar21 = 0;
            uVar26 = local_b80;
            pauVar22 = (undefined1 (*) [64])local_b70._0_8_;
            do {
              pauVar23 = (undefined1 (*) [64])
                         ((long)local_a20.data +
                         (uVar26 >> 4 & 0xfffffff) * 0x40 +
                         local_a20.elemsize * local_a20.cstep * lVar25);
              lVar27 = -0x180;
              do {
                auVar37 = vaddps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar23 + (long)(iVar18 * 0x20) * 4),
                                         *(undefined1 (*) [64])
                                          (*pauVar23 + (long)(iVar18 * 0x10) * 4));
                auVar40 = vsubps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar23 + (long)(iVar18 * 0x10) * 4),
                                         *(undefined1 (*) [64])
                                          (*pauVar23 + (long)(iVar18 * 0x20) * 4));
                auVar38 = vaddps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar23 + (long)(iVar18 * 0x40) * 4),
                                         *(undefined1 (*) [64])
                                          (*pauVar23 + (long)(iVar18 * 0x30) * 4));
                auVar33 = vsubps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar23 + (long)(iVar18 * 0x30) * 4),
                                         *(undefined1 (*) [64])
                                          (*pauVar23 + (long)(iVar18 * 0x40) * 4));
                auVar34 = vaddps_avx512f(auVar37,*pauVar23);
                auVar34 = vaddps_avx512f(auVar34,auVar38);
                auVar35 = vaddps_avx512f(auVar40,*(undefined1 (*) [64])
                                                  (*pauVar23 + (long)(iVar18 * 0x50) * 4));
                auVar40 = vfmadd231ps_avx512f(auVar40,auVar33,auVar30);
                auVar37 = vfmadd231ps_avx512f(auVar37,auVar38,auVar31);
                auVar38 = vfmadd231ps_avx512f(auVar35,auVar33,auVar32);
                *(undefined1 (*) [64])(auStack_800 + lVar27) = auVar34;
                *(undefined1 (*) [64])(auStack_680 + lVar27) = auVar40;
                *(undefined1 (*) [64])(auStack_500 + lVar27) = auVar37;
                *(undefined1 (*) [64])(auStack_380 + lVar27) = auVar38;
                pauVar23 = (undefined1 (*) [64])(*pauVar23 + (long)(iVar18 * 0x60) * 4);
                lVar27 = lVar27 + 0x40;
              } while (lVar27 != 0);
              lVar27 = 0x140;
              pauVar23 = pauVar22;
              do {
                auVar37 = *(undefined1 (*) [64])((long)&local_a70.h + lVar27);
                auVar40 = *(undefined1 (*) [64])((long)&local_a20.allocator + lVar27);
                auVar38 = vaddps_avx512f(auVar37,*(undefined1 (*) [64])((long)&local_a80 + lVar27));
                auVar37 = vsubps_avx512f(*(undefined1 (*) [64])((long)&local_a80 + lVar27),auVar37);
                auVar33 = vaddps_avx512f(*(undefined1 (*) [64])((long)&local_9c0 + lVar27),auVar40);
                auVar40 = vsubps_avx512f(auVar40,*(undefined1 (*) [64])((long)&local_9c0 + lVar27));
                auVar34 = vaddps_avx512f(auVar39,*(undefined1 (*) [64])
                                                  ((long)&local_ad0.elemsize + lVar27));
                auVar34 = vaddps_avx512f(auVar34,auVar38);
                auVar34 = vaddps_avx512f(auVar34,auVar33);
                auVar35 = vaddps_avx512f(auVar37,*(undefined1 (*) [64])(auStack_980 + lVar27));
                auVar37 = vfmadd231ps_avx512f(auVar37,auVar40,auVar30);
                auVar37 = vaddps_avx512f(auVar37,auVar39);
                auVar38 = vfmadd231ps_avx512f(auVar38,auVar33,auVar31);
                auVar38 = vaddps_avx512f(auVar38,auVar39);
                auVar40 = vfmadd231ps_avx512f(auVar35,auVar40,auVar32);
                auVar40 = vaddps_avx512f(auVar40,auVar39);
                pauVar23[-3] = auVar34;
                pauVar23[-2] = auVar37;
                pauVar23[-1] = auVar38;
                *pauVar23 = auVar40;
                lVar27 = lVar27 + 0x180;
                pauVar23 = (undefined1 (*) [64])(*pauVar23 + (long)(local_b60.w << 4) * 4);
              } while (lVar27 != 0x740);
              uVar21 = uVar21 + 1;
              uVar26 = uVar26 + 0x10;
              pauVar22 = pauVar22 + 4;
            } while (uVar21 != uVar17);
          }
          local_b80 = local_b80 + local_b00;
          local_b70._0_8_ = (undefined1 *)local_b70._0_8_ + local_ae8;
          uVar26 = local_ae0 + 1;
        } while (local_ae0 + 1 != local_af8);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != local_b08);
  }
  copy_cut_border(&local_b60,local_a78,0,local_b60.h - local_a78->h,0,local_b60.w - local_a78->w,
                  local_a80);
  piVar6 = (int *)CONCAT44(local_b60.refcount._4_4_,local_b60.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_b60.allocator == (Allocator *)0x0) {
        if (local_b60.data != (void *)0x0) {
          free(local_b60.data);
        }
      }
      else {
        (*(local_b60.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_b60.cstep = 0;
  local_b60.data = (void *)0x0;
  local_b60.refcount._0_4_ = 0;
  local_b60.refcount._4_4_ = 0;
  local_b60.elemsize = 0;
  local_b60.elempack = 0;
  local_b60.dims = 0;
  local_b60.w = 0;
  local_b60.h = 0;
  local_b60.d = 0;
  local_b60.c = 0;
  piVar6 = (int *)CONCAT44(local_a20.refcount._4_4_,local_a20.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_a20.allocator == (Allocator *)0x0) {
        if (local_a20.data != (void *)0x0) {
          free(local_a20.data);
        }
      }
      else {
        (*(local_a20.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_a20.cstep = 0;
  local_a20.data = (void *)0x0;
  local_a20.refcount._0_4_ = 0;
  local_a20.refcount._4_4_ = 0;
  local_a20.elemsize = 0;
  local_a20.elempack = 0;
  local_a20.dims = 0;
  local_a20.w = 0;
  local_a20.h = 0;
  local_a20.d = 0;
  local_a20.c = 0;
  piVar6 = (int *)CONCAT44(local_a70.refcount._4_4_,local_a70.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_a70.allocator == (Allocator *)0x0) {
        if (local_a70.data != (void *)0x0) {
          free(local_a70.data);
        }
      }
      else {
        (*(local_a70.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_a70.cstep = 0;
  local_a70.data = (void *)0x0;
  local_a70.refcount._0_4_ = 0;
  local_a70.refcount._4_4_ = 0;
  local_a70.elemsize = 0;
  local_a70.elempack = 0;
  local_a70.dims = 0;
  local_a70.w = 0;
  local_a70.h = 0;
  local_a70.d = 0;
  local_a70.c = 0;
  piVar6 = (int *)CONCAT44(local_ad0.refcount._4_4_,local_ad0.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_ad0.allocator == (Allocator *)0x0) {
        if (local_ad0.data != (void *)0x0) {
          free(local_ad0.data);
        }
      }
      else {
        (*(local_ad0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 4;
        int h_tiles = outh / 4;
        const int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 36, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd43_transform_input_pack16_avx512(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack16_avx512(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd43_transform_output_pack16_avx512(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}